

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidselect.cpp
# Opt level: O1

void setIds(IDManifest *mfst,
           list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
           *ids,char **matches,int numMatches,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *channelToPos)

{
  size_t *psVar1;
  _Rb_tree_color _Var2;
  char *__s1;
  size_t sVar3;
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  *plVar4;
  int iVar5;
  _List_node_base *p_Var6;
  long lVar7;
  ulong uVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  long *plVar11;
  _Rb_tree_node_base *p_Var12;
  const_iterator cVar13;
  const_iterator cVar14;
  _List_node_base *p_Var15;
  ostream *poVar16;
  int *piVar17;
  undefined8 uVar18;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *p_Var19;
  string matchString;
  size_t i;
  string componentName;
  _List_node_base local_e8;
  _List_node_base local_d8;
  ulong local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_c0;
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  *local_b8;
  _Rb_tree_color local_b0;
  _Rb_tree_color local_ac;
  ulong local_a8;
  _Rb_tree_node_base *local_a0;
  _Base_ptr local_98;
  key_type local_90;
  string local_70;
  undefined7 uStack_6f;
  long local_60 [2];
  long local_50;
  ulong local_48;
  char **local_40;
  ulong local_38;
  
  local_c0 = &channelToPos->_M_t;
  local_40 = matches;
  std::__cxx11::
  _List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ::_M_clear(&ids->
              super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
            );
  (ids->
  super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)ids;
  (ids->
  super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)ids;
  (ids->
  super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  )._M_impl._M_node._M_size = 0;
  local_d8._M_next = (_List_node_base *)0x0;
  local_e8._M_next = &local_e8;
  local_e8._M_prev = &local_e8;
  local_b8 = ids;
  p_Var6 = (_List_node_base *)operator_new(0x28);
  p_Var15 = p_Var6 + 1;
  p_Var6[1]._M_next = local_e8._M_next;
  p_Var6[1]._M_prev = local_e8._M_prev;
  p_Var6[2]._M_next = local_d8._M_next;
  if (local_e8._M_next == &local_e8) {
    p_Var6[1]._M_prev = p_Var15;
    p_Var6[1]._M_next = p_Var15;
  }
  else {
    (local_e8._M_prev)->_M_next = p_Var15;
    p_Var15->_M_next->_M_prev = p_Var15;
    local_d8._M_next = (_List_node_base *)0x0;
    local_e8._M_next = &local_e8;
    local_e8._M_prev = &local_e8;
  }
  plVar4 = local_b8;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(plVar4->
            super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var6 = local_e8._M_next;
  p_Var19 = local_c0;
  while (local_c0 = p_Var19, p_Var6 != &local_e8) {
    p_Var15 = p_Var6->_M_next;
    operator_delete(p_Var6,0x20);
    p_Var6 = p_Var15;
    p_Var19 = local_c0;
  }
  if (0 < numMatches) {
    local_98 = &(p_Var19->_M_impl).super__Rb_tree_header._M_header;
    local_48 = (ulong)(uint)numMatches;
    local_38 = 0;
    do {
      __s1 = local_40[local_38];
      iVar5 = strcmp(__s1,"--and");
      if (iVar5 == 0) {
        local_d8._M_next = (_List_node_base *)0x0;
        local_e8._M_next = &local_e8;
        local_e8._M_prev = &local_e8;
        p_Var6 = (_List_node_base *)operator_new(0x28);
        p_Var15 = p_Var6 + 1;
        p_Var6[1]._M_next = local_e8._M_next;
        p_Var6[1]._M_prev = local_e8._M_prev;
        p_Var6[2]._M_next = local_d8._M_next;
        if (local_e8._M_next == &local_e8) {
          p_Var6[1]._M_prev = p_Var15;
          p_Var6[1]._M_next = p_Var15;
        }
        else {
          (local_e8._M_prev)->_M_next = p_Var15;
          p_Var15->_M_next->_M_prev = p_Var15;
          local_d8._M_next = (_List_node_base *)0x0;
          local_e8._M_next = &local_e8;
          local_e8._M_prev = &local_e8;
        }
        plVar4 = local_b8;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        p_Var19 = local_c0;
        psVar1 = &(plVar4->
                  super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var6 = local_e8._M_next;
        while (p_Var6 != &local_e8) {
          p_Var15 = p_Var6->_M_next;
          operator_delete(p_Var6,0x20);
          p_Var6 = p_Var15;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,__s1,(allocator<char> *)&local_90);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        lVar7 = std::__cxx11::string::find((char)&local_e8,0x3a);
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_e8);
          std::__cxx11::string::operator=((string *)&local_90,&local_70);
          if ((long *)CONCAT71(uStack_6f,local_70) != local_60) {
            operator_delete((long *)CONCAT71(uStack_6f,local_70),local_60[0] + 1);
          }
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_e8);
          std::__cxx11::string::operator=((string *)&local_e8,&local_70);
          if ((long *)CONCAT71(uStack_6f,local_70) != local_60) {
            operator_delete((long *)CONCAT71(uStack_6f,local_70),local_60[0] + 1);
          }
        }
        lVar7 = std::__cxx11::string::find_first_not_of((char *)&local_e8,0x10843d,0);
        if (lVar7 == -1) {
          cVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(p_Var19,&local_90);
          p_Var6 = local_e8._M_next;
          if (cVar13._M_node != local_98) {
            _Var2 = cVar13._M_node[2]._M_color;
            piVar17 = __errno_location();
            iVar5 = *piVar17;
            *piVar17 = 0;
            lVar7 = strtol((char *)p_Var6,(char **)&local_70,10);
            p_Var19 = local_c0;
            if ((_List_node_base *)CONCAT71(uStack_6f,local_70) == p_Var6) {
LAB_00106393:
              uVar18 = std::__throw_invalid_argument("stoi");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,
                                CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                         local_90.field_2._M_local_buf[0]) + 1);
              }
              if (local_e8._M_next != &local_d8) {
                operator_delete(local_e8._M_next,(ulong)((long)&(local_d8._M_next)->_M_next + 1));
              }
              _Unwind_Resume(uVar18);
            }
            if (((int)lVar7 != lVar7) || (*piVar17 == 0x22)) {
              std::__throw_out_of_range("stoi");
              goto LAB_00106393;
            }
            if (*piVar17 == 0) {
              *piVar17 = iVar5;
            }
            p_Var6 = (local_b8->
                     super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                     )._M_impl._M_node.super__List_node_base._M_prev;
            p_Var15 = (_List_node_base *)operator_new(0x20);
            *(_Rb_tree_color *)&p_Var15[1]._M_next = _Var2;
            *(int *)((long)&p_Var15[1]._M_next + 4) = (int)lVar7;
            *(undefined4 *)&p_Var15[1]._M_prev = 0xffffffff;
            std::__detail::_List_node_base::_M_hook(p_Var15);
            p_Var6 = p_Var6 + 2;
            p_Var6->_M_next = (_List_node_base *)((long)&p_Var6->_M_next->_M_next + 1);
          }
        }
        else {
          local_c8 = 0;
          while (uVar8 = Imf_3_4::IDManifest::size(), local_c8 < uVar8) {
            Imf_3_4::IDManifest::operator[]((ulong)mfst);
            p_Var9 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::begin();
            while( true ) {
              Imf_3_4::IDManifest::operator[]((ulong)mfst);
              p_Var10 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::end();
              if (p_Var9 == p_Var10) break;
              if (p_Var9[1]._M_left != p_Var9[1]._M_parent) {
                local_a8 = 0;
                do {
                  iVar5 = std::__cxx11::string::compare((char *)&local_90);
                  if (iVar5 == 0) {
LAB_00105c48:
                    local_50 = local_a8 * 0x20;
                    lVar7 = std::__cxx11::string::find
                                      ((char *)(p_Var9[1]._M_parent + local_a8),
                                       (ulong)local_e8._M_next,0);
                    if (lVar7 != -1) {
                      lVar7 = Imf_3_4::IDManifest::operator[]((ulong)mfst);
                      sVar3 = *(size_t *)(lVar7 + 0x78);
                      if ((sVar3 == _find_first_not_of) &&
                         ((sVar3 == 0 ||
                          (iVar5 = bcmp(*(void **)(lVar7 + 0x70),
                                        Imf_3_4::IDManifest::ID_SCHEME_abi_cxx11_,sVar3), iVar5 == 0
                          )))) {
                        Imf_3_4::IDManifest::operator[]((ulong)mfst);
                        lVar7 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
                        for (p_Var10 = *(_Rb_tree_node_base **)(lVar7 + 0x18);
                            p_Var10 != (_Rb_tree_node_base *)(lVar7 + 8);
                            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
                          cVar13 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   ::find(local_c0,(key_type *)(p_Var10 + 1));
                          if (cVar13._M_node != local_98) {
                            _Var2 = cVar13._M_node[2]._M_color;
                            uVar18 = *(undefined8 *)(p_Var9 + 1);
                            p_Var6 = (local_b8->
                                     super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                                     )._M_impl._M_node.super__List_node_base._M_prev;
                            p_Var15 = (_List_node_base *)operator_new(0x20);
                            *(_Rb_tree_color *)&p_Var15[1]._M_next = _Var2;
                            *(int *)((long)&p_Var15[1]._M_next + 4) = (int)uVar18;
                            *(undefined4 *)&p_Var15[1]._M_prev = 0xffffffff;
                            std::__detail::_List_node_base::_M_hook(p_Var15);
                            p_Var6 = p_Var6 + 2;
                            p_Var6->_M_next =
                                 (_List_node_base *)((long)&p_Var6->_M_next->_M_next + 1);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,"adding match ",0xd);
                            *(uint *)(*(long *)(std::cerr + -0x18) + 0x10c338) =
                                 *(uint *)(*(long *)(std::cerr + -0x18) + 0x10c338) & 0xffffffb5 | 8
                            ;
                            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                            *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) =
                                 *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) &
                                 0xffffffb5 | 2;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16," for string ",0xc);
                            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar16,*(char **)((long)&(p_Var9[1]._M_parent)->
                                                                           _M_color + local_50),
                                                 *(long *)((long)&(p_Var9[1]._M_parent)->_M_parent +
                                                          local_50));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16," in channel ",0xc);
                            poVar16 = (ostream *)
                                      std::ostream::operator<<
                                                ((ostream *)poVar16,cVar13._M_node[2]._M_color);
                            local_70 = (string)0x28;
                            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar16,(char *)&local_70,1);
                            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar16,*(char **)(cVar13._M_node + 1),
                                                 (long)cVar13._M_node[1]._M_parent);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar16,")\n",2);
                          }
                        }
                      }
                      else {
                        lVar7 = Imf_3_4::IDManifest::operator[]((ulong)mfst);
                        sVar3 = *(size_t *)(lVar7 + 0x78);
                        if ((sVar3 == _strcmp) &&
                           ((sVar3 == 0 ||
                            (iVar5 = bcmp(*(void **)(lVar7 + 0x70),
                                          Imf_3_4::IDManifest::ID2_SCHEME_abi_cxx11_,sVar3),
                            iVar5 == 0)))) {
                          Imf_3_4::IDManifest::operator[]((ulong)mfst);
                          lVar7 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_
                                            ();
                          p_Var10 = *(_Rb_tree_node_base **)(lVar7 + 0x18);
                          Imf_3_4::IDManifest::operator[]((ulong)mfst);
                          lVar7 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_
                                            ();
                          p_Var12 = (_Rb_tree_node_base *)(lVar7 + 8);
                          if (p_Var10 != (_Rb_tree_node_base *)(lVar7 + 8)) {
                            do {
                              local_a0 = p_Var12;
                              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
                              p_Var19 = local_c0;
                              if (p_Var12 != local_a0) {
                                cVar13 = std::
                                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                         ::find(local_c0,(key_type *)(p_Var10 + 1));
                                cVar14 = std::
                                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                         ::find(p_Var19,(key_type *)(p_Var12 + 1));
                                if (cVar14._M_node != local_98 && cVar13._M_node != local_98) {
                                  local_ac = cVar13._M_node[2]._M_color;
                                  uVar18 = *(undefined8 *)(p_Var9 + 1);
                                  local_b0 = cVar14._M_node[2]._M_color;
                                  p_Var6 = (local_b8->
                                           super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                                           )._M_impl._M_node.super__List_node_base._M_prev;
                                  p_Var15 = (_List_node_base *)operator_new(0x20);
                                  *(_Rb_tree_color *)&p_Var15[1]._M_next = local_ac;
                                  *(int *)((long)&p_Var15[1]._M_next + 4) = (int)uVar18;
                                  *(_Rb_tree_color *)&p_Var15[1]._M_prev = local_b0;
                                  *(int *)((long)&p_Var15[1]._M_prev + 4) =
                                       (int)((ulong)uVar18 >> 0x20);
                                  std::__detail::_List_node_base::_M_hook(p_Var15);
                                  p_Var6 = p_Var6 + 2;
                                  p_Var6->_M_next =
                                       (_List_node_base *)((long)&p_Var6->_M_next->_M_next + 1);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,"adding match ",0xd);
                                  *(uint *)(*(long *)(std::cerr + -0x18) + 0x10c338) =
                                       *(uint *)(*(long *)(std::cerr + -0x18) + 0x10c338) &
                                       0xffffffb5 | 8;
                                  poVar16 = std::ostream::_M_insert<unsigned_long>
                                                      ((ulong)&std::cerr);
                                  *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) =
                                       *(uint *)(poVar16 +
                                                *(long *)(*(long *)poVar16 + -0x18) + 0x18) &
                                       0xffffffb5 | 2;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar16," for string ",0xc);
                                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar16,*(char **)((long)&(p_Var9[1].
                                                                                 _M_parent)->
                                                                                 _M_color + local_50
                                                                         ),
                                                       *(long *)((long)&(p_Var9[1]._M_parent)->
                                                                        _M_parent + local_50));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,": ",2)
                                  ;
                                  *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) =
                                       *(uint *)(poVar16 +
                                                *(long *)(*(long *)poVar16 + -0x18) + 0x18) &
                                       0xffffffb5 | 8;
                                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar16," in channel ",0xc);
                                  poVar16 = (ostream *)
                                            std::ostream::operator<<((ostream *)poVar16,local_ac);
                                  local_70 = (string)0x28;
                                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar16,(char *)&local_70,1);
                                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar16,*(char **)(cVar13._M_node + 1),
                                                       (long)cVar13._M_node[1]._M_parent);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar16,"), ",3);
                                  *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) =
                                       *(uint *)(poVar16 +
                                                *(long *)(*(long *)poVar16 + -0x18) + 0x18) &
                                       0xffffffb5 | 8;
                                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar16," in channel ",0xc);
                                  poVar16 = (ostream *)
                                            std::ostream::operator<<((ostream *)poVar16,local_b0);
                                  local_70 = (string)0x28;
                                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar16,(char *)&local_70,1);
                                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar16,*(char **)(cVar14._M_node + 1),
                                                       (long)cVar14._M_node[1]._M_parent);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar16,")\n",2);
                                }
                                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
                                if (p_Var10 != local_a0) {
                                  p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
                                }
                              }
                              p_Var12 = local_a0;
                            } while (p_Var10 != local_a0);
                          }
                        }
                      }
                    }
                  }
                  else {
                    Imf_3_4::IDManifest::operator[]((ulong)mfst);
                    plVar11 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::
                                      getComponents_abi_cxx11_();
                    sVar3 = *(size_t *)(*plVar11 + 8 + local_a8 * 0x20);
                    if ((sVar3 == local_90._M_string_length) &&
                       ((sVar3 == 0 ||
                        (iVar5 = bcmp(*(void **)(*plVar11 + local_a8 * 0x20),
                                      local_90._M_dataplus._M_p,sVar3), iVar5 == 0))))
                    goto LAB_00105c48;
                  }
                  local_a8 = local_a8 + 1;
                } while (local_a8 <
                         (ulong)((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent >> 5));
              }
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
              p_Var19 = local_c0;
            }
            local_c8 = local_c8 + 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        if (local_e8._M_next != &local_d8) {
          operator_delete(local_e8._M_next,(ulong)((long)&(local_d8._M_next)->_M_next + 1));
        }
      }
      local_38 = local_38 + 1;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

void
setIds (
    const IDManifest&       mfst,
    list<list<match>>&      ids,
    const char*             matches[],
    int                     numMatches,
    const map<string, int>& channelToPos)
{

    //
    // initially one single list
    //
    ids.clear ();
    ids.push_back (list<match> ());

    //
    // check each manifest, each entry, against each matching expression
    //
    for (int c = 0; c < numMatches; ++c)
    {

        //
        // an 'and' argument means proceed to the next group of ids
        // must find a match in every such group
        //
        if (strcmp (matches[c], "--and") == 0)
        {
            ids.push_back (list<match> ());
            continue;
        }

        string matchString (matches[c]);

        //
        // handle strings of the form component:searchstring
        // and channel:idnumber
        //
        string            componentName;
        string::size_type pos = matchString.find (':');
        if (pos != string::npos)
        {
            componentName = matchString.substr (0, pos);
            matchString   = matchString.substr (pos + 1);
        }

        if (matchString.find_first_not_of ("0123456789") == string::npos)
        {
            map<string, int>::const_iterator chan =
                channelToPos.find (componentName);
            if (chan != channelToPos.end ())
            {
                match m;
                m.channel1 = chan->second;
                m.id1      = stoi (matchString);
                m.channel2 = -1;
                ids.back ().push_back (m);
            }
            continue; // skip parsing the manifests for this string
        }

        // check the manifest for each group of channels
        for (size_t i = 0; i < mfst.size (); ++i)
        {

            for (IDManifest::ChannelGroupManifest::ConstIterator it =
                     mfst[i].begin ();
                 it != mfst[i].end ();
                 ++it)
            {
                for (size_t stringIndex = 0; stringIndex < it.text ().size ();
                     ++stringIndex)
                {
                    if (componentName == "" ||
                        mfst[i].getComponents ()[stringIndex] == componentName)
                    {
                        // simple substring matching only: could do wildcards or regexes here instead
                        if (it.text ()[stringIndex].find (matchString) !=
                            string::npos)
                        {
                            // a match is found - add it to the corresponding channels
                            if (mfst[i].getEncodingScheme () ==
                                IDManifest::ID_SCHEME)
                            {
                                // simple scheme: the ID channel has to match
                                for (const string& s: mfst[i].getChannels ())
                                {
                                    map<string, int>::const_iterator chan =
                                        channelToPos.find (s);
                                    if (chan != channelToPos.end ())
                                    {
                                        //could support matching the ID against a specific channel
                                        //that check would happen here

                                        match m;
                                        m.channel1 = chan->second;
                                        m.id1      = uint32_t (it.id ());
                                        m.channel2 = -1;
                                        ids.back ().push_back (m);
                                        cerr << "adding match " << hex
                                             << it.id () << dec
                                             << " for string "
                                             << it.text ()[stringIndex]
                                             << " in channel " << chan->second
                                             << '(' << chan->first << ")\n";
                                    }
                                }
                            }
                            else if (
                                mfst[i].getEncodingScheme () ==
                                IDManifest::ID2_SCHEME)
                            {
                                // 64 bit IDs are spread across two channels, with the least significant bits
                                // in the first channel (alphabetically) and the most significant bits in the second
                                // so process the channel set in pairs

                                set<string>::const_iterator chanLow =
                                    mfst[i].getChannels ().begin ();
                                set<string>::const_iterator end =
                                    mfst[i].getChannels ().end ();

                                while (chanLow != end)
                                {
                                    set<string>::const_iterator chanHigh =
                                        chanLow;
                                    ++chanHigh;

                                    if (chanHigh != end)
                                    {
                                        map<string, int>::const_iterator
                                            chanIdxLow =
                                                channelToPos.find (*chanLow);
                                        map<string, int>::const_iterator
                                            chanIdxHigh =
                                                channelToPos.find (*chanHigh);

                                        if (chanIdxLow != channelToPos.end () &&
                                            chanIdxHigh != channelToPos.end ())
                                        {
                                            // to match against specific channels, check at least one channel matches here
                                            match m;
                                            m.channel1 = chanIdxLow->second;
                                            m.id1      = it.id () & 0xFFFFFFFF;
                                            m.channel2 = chanIdxHigh->second;
                                            m.id2      = it.id () >> 32;
                                            ids.back ().push_back (m);

                                            cerr << "adding match " << hex
                                                 << it.id () << dec
                                                 << " for string "
                                                 << it.text ()[stringIndex]
                                                 << ": " << hex << m.id1
                                                 << " in channel " << m.channel1
                                                 << '(' << chanIdxLow->first
                                                 << "), " << hex << m.id2
                                                 << " in channel " << m.channel2
                                                 << '(' << chanIdxHigh->first
                                                 << ")\n";
                                        }

                                        ++chanLow;
                                        if (chanLow != end) { ++chanLow; }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}